

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor_internal.h
# Opt level: O2

void __thiscall
absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
~StatusOrData(StatusOrData<google::protobuf::FeatureResolver> *this)

{
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1 aVar1;
  
  aVar1 = this->field_0;
  Status::~Status((Status *)this);
  if (aVar1 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1)0x1) {
    google::protobuf::FeatureSet::~FeatureSet(&(this->field_1).data_.defaults_);
    return;
  }
  return;
}

Assistant:

~StatusOrData() {
    if (ok()) {
      status_.~Status();
      data_.~T();
    } else {
      status_.~Status();
    }
  }